

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

FloatParts return_nan(FloatParts a,float_status *s)

{
  ulong uVar1;
  ulong uVar3;
  ulong uVar4;
  FloatParts FVar5;
  ulong uVar2;
  
  uVar3 = a._8_8_;
  uVar4 = a.frac;
  if (a.cls != float_class_qnan) {
    if ((a._12_4_ & 0xff) != 5) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x38e,(char *)0x0);
    }
    s->float_exception_flags = s->float_exception_flags | 1;
    uVar3 = uVar3 & 0xffffff00ffffffff | 0x400000000;
    uVar4 = uVar4 | 0x2000000000000000;
  }
  uVar2 = 0x47fffffff;
  uVar1 = 0x2000000000000000;
  if (s->default_nan_mode == '\0') {
    uVar2 = uVar3;
    uVar1 = uVar4;
  }
  FVar5.exp = (int)uVar2;
  FVar5.cls = (char)(uVar2 >> 0x20);
  FVar5.sign = (_Bool)(char)(uVar2 >> 0x28);
  FVar5._14_2_ = (short)(uVar2 >> 0x30);
  FVar5.frac = uVar1;
  return FVar5;
}

Assistant:

static FloatParts return_nan(FloatParts a, float_status *s)
{
    switch (a.cls) {
    case float_class_snan:
        s->float_exception_flags |= float_flag_invalid;
        a = parts_silence_nan(a, s);
        /* fall through */
    case float_class_qnan:
        if (s->default_nan_mode) {
            return parts_default_nan(s);
        }
        break;

    default:
        g_assert_not_reached();
        break;
    }
    return a;
}